

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_simple.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::Binder::BindAlterAddIndex
          (BoundStatement *__return_storage_ptr__,Binder *this,BoundStatement *result,
          CatalogEntry *entry,
          unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *alter_info)

{
  pointer pPVar1;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var2;
  _Alloc_hider _Var3;
  __node_base this_00;
  BoundStatement *pBVar4;
  pointer pAVar5;
  ColumnList *pCVar6;
  string *table;
  pointer this_01;
  BoundUniqueConstraint *pBVar7;
  pointer pCVar8;
  ColumnDefinition *this_02;
  pointer pPVar9;
  pointer this_03;
  UniqueConstraint *pUVar10;
  pointer pBVar11;
  pointer this_04;
  LogicalGet *pLVar12;
  BinderException *this_05;
  Binder *pBVar13;
  pointer pPVar14;
  _Head_base<0UL,_duckdb::CreateIndexInfo_*,_false> local_1b0;
  undefined1 local_1a8 [48];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_178;
  ColumnList *local_170;
  undefined1 local_168 [8];
  string local_160;
  __node_base local_140;
  BoundStatement *local_138;
  unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *local_130;
  CatalogEntry *local_128;
  pointer local_120;
  Binder *local_118;
  __node_base local_110;
  string index_name;
  UniqueConstraint unique_constraint;
  TableDescription table_description;
  
  pBVar13 = this;
  local_138 = result;
  local_130 = alter_info;
  pAVar5 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     (alter_info);
  local_128 = entry;
  pCVar6 = TableCatalogEntry::GetColumns((TableCatalogEntry *)entry);
  local_110._M_nxt = (_Hash_node_base *)(pAVar5 + 1);
  table = (string *)
          unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::operator*
                    ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                      *)local_110._M_nxt);
  local_1a8._8_8_ = &pAVar5->name;
  local_170 = pCVar6;
  BindUniqueConstraint
            ((Binder *)local_168,(Constraint *)pBVar13,table,(ColumnList *)local_1a8._8_8_);
  this_01 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
            ::operator->((unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                          *)local_168);
  pBVar7 = BoundConstraint::Cast<duckdb::BoundUniqueConstraint>(this_01);
  make_uniq<duckdb::CreateIndexInfo>();
  local_140._M_nxt = (_Hash_node_base *)__return_storage_ptr__;
  local_120 = pAVar5;
  local_118 = this;
  pCVar8 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&local_1b0);
  ::std::__cxx11::string::_M_assign((string *)&pCVar8->table);
  pCVar8 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&local_1b0);
  ::std::__cxx11::string::assign((char *)&pCVar8->index_type);
  pCVar8 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&local_1b0);
  pCVar8->constraint_type = PRIMARY;
  pPVar1 = (pBVar7->keys).
           super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
           super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pPVar14 = (pBVar7->keys).
                 super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                 super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                 _M_impl.super__Vector_impl_data._M_start; pPVar14 != pPVar1; pPVar14 = pPVar14 + 1)
  {
    this_02 = ColumnList::GetColumn(local_170,(PhysicalIndex)pPVar14->index);
    ColumnDefinition::GetName_abi_cxx11_(&table_description.database,this_02);
    make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string,std::__cxx11::string&>
              ((duckdb *)&index_name,&table_description.database,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._8_8_)
    ;
    unique_constraint.super_Constraint._vptr_Constraint = (_func_int **)index_name._M_dataplus._M_p;
    index_name._M_dataplus._M_p = (pointer)0x0;
    ::std::__cxx11::string::~string((string *)&table_description);
    pCVar8 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                           *)&local_1b0);
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&unique_constraint);
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&table_description,pPVar9);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pCVar8->expressions,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&table_description);
    if (table_description.database._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)table_description.database._M_dataplus._M_p + 8))();
    }
    pCVar8 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                           *)&local_1b0);
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)&unique_constraint);
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&table_description,pPVar9);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pCVar8->parsed_expressions,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&table_description);
    if (table_description.database._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)table_description.database._M_dataplus._M_p + 8))();
    }
    if (unique_constraint.super_Constraint._vptr_Constraint != (_func_int **)0x0) {
      (**(code **)(*unique_constraint.super_Constraint._vptr_Constraint + 8))();
    }
  }
  this_03 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
            operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                        *)local_110._M_nxt);
  pUVar10 = Constraint::Cast<duckdb::UniqueConstraint>(this_03);
  UniqueConstraint::UniqueConstraint(&unique_constraint,pUVar10);
  UniqueConstraint::GetName(&index_name,&unique_constraint,(string *)local_1a8._8_8_);
  pBVar13 = local_118;
  pAVar5 = local_120;
  pCVar8 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&local_1b0);
  ::std::__cxx11::string::_M_assign((string *)&pCVar8->index_name);
  TableDescription::TableDescription
            (&table_description,&pAVar5->catalog,&pAVar5->schema,(string *)local_1a8._8_8_);
  make_uniq<duckdb::BaseTableRef,duckdb::TableDescription&>((duckdb *)&local_178,&table_description)
  ;
  unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::operator*
            ((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true> *)
             &local_178);
  Bind((Binder *)(local_1a8 + 0x28),(BaseTableRef *)pBVar13);
  pBVar11 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
            operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                        *)(local_1a8 + 0x28));
  if (pBVar11->type == BASE_TABLE) {
    unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
              ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                *)(local_1a8 + 0x28));
    CreatePlan((Binder *)local_1a8,(BoundTableRef *)pBVar13);
    this_04 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_1a8);
    pLVar12 = LogicalOperator::Cast<duckdb::LogicalGet>(this_04);
    ColumnList::GetColumnNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)(local_168 + 8),local_170);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&pLVar12->names,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_168 + 8));
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_168 + 8));
    local_1a8._32_8_ = local_1a8._0_8_;
    local_1a8._16_8_ =
         (local_130->super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>).
         _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t
         .super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
         super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
    (local_130->super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
    super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)0x0;
    local_1a8._0_8_ =
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0;
    local_1a8._24_8_ = local_1b0._M_head_impl;
    local_1b0._M_head_impl = (CreateIndexInfo *)0x0;
    (**(code **)(*local_128[1]._vptr_CatalogEntry + 0x90))
              (local_168 + 8,local_128[1]._vptr_CatalogEntry,pBVar13);
    pBVar4 = local_138;
    this_00._M_nxt = local_140._M_nxt;
    _Var3._M_p = local_160._M_dataplus._M_p;
    local_160._M_dataplus._M_p = (pointer)0x0;
    _Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (local_138->plan).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (local_138->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)_Var3._M_p;
    if (_Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      (**(code **)(*(long *)_Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                            _M_head_impl + 8))();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._M_dataplus._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(*(_func_int ***)local_160._M_dataplus._M_p)[1])();
      }
    }
    local_160._M_dataplus._M_p = (pointer)0x0;
    if ((ClientContext *)local_1a8._16_8_ != (ClientContext *)0x0) {
      (*((ParseInfo *)local_1a8._16_8_)->_vptr_ParseInfo[1])();
    }
    local_1a8._16_8_ = (ClientContext *)0x0;
    if ((CreateIndexInfo *)local_1a8._24_8_ != (CreateIndexInfo *)0x0) {
      (*(((CreateInfo *)local_1a8._24_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    local_1a8._24_8_ = (__buckets_ptr)0x0;
    if ((element_type *)local_1a8._32_8_ != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_1a8._32_8_)->__weak_this_).
                  internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_1a8._32_8_ = 0;
    BoundStatement::BoundStatement((BoundStatement *)this_00._M_nxt,pBVar4);
    if ((element_type *)local_1a8._0_8_ != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_1a8._0_8_)->__weak_this_).
                  internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    if ((_Hash_node_base *)local_1a8._40_8_ != (_Hash_node_base *)0x0) {
      (*(code *)(*(_Hash_node_base **)local_1a8._40_8_)[1]._M_nxt)();
    }
    if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(local_178._M_pi)->_vptr__Sp_counted_base[1])();
    }
    TableDescription::~TableDescription(&table_description);
    ::std::__cxx11::string::~string((string *)&index_name);
    UniqueConstraint::~UniqueConstraint(&unique_constraint);
    if (local_1b0._M_head_impl != (CreateIndexInfo *)0x0) {
      (*((local_1b0._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    }
    if (local_168 != (undefined1  [8])0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_168)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    return (BoundStatement *)this_00._M_nxt;
  }
  this_05 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)(local_168 + 8),"can only add an index to a base table",
             (allocator *)local_1a8);
  BinderException::BinderException(this_05,(string *)(local_168 + 8));
  __cxa_throw(this_05,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BoundStatement Binder::BindAlterAddIndex(BoundStatement &result, CatalogEntry &entry,
                                         unique_ptr<AlterInfo> alter_info) {
	auto &table_info = alter_info->Cast<AlterTableInfo>();
	auto &constraint_info = table_info.Cast<AddConstraintInfo>();
	auto &table = entry.Cast<TableCatalogEntry>();
	auto &column_list = table.GetColumns();

	auto bound_constraint = BindUniqueConstraint(*constraint_info.constraint, table_info.name, column_list);
	auto &bound_unique = bound_constraint->Cast<BoundUniqueConstraint>();

	// Create the CreateIndexInfo.
	auto create_index_info = make_uniq<CreateIndexInfo>();
	create_index_info->table = table_info.name;
	create_index_info->index_type = ART::TYPE_NAME;
	create_index_info->constraint_type = IndexConstraintType::PRIMARY;

	for (const auto &physical_index : bound_unique.keys) {
		auto &col = column_list.GetColumn(physical_index);
		unique_ptr<ParsedExpression> parsed = make_uniq<ColumnRefExpression>(col.GetName(), table_info.name);
		create_index_info->expressions.push_back(parsed->Copy());
		create_index_info->parsed_expressions.push_back(parsed->Copy());
	}

	auto unique_constraint = constraint_info.constraint->Cast<UniqueConstraint>();
	auto index_name = unique_constraint.GetName(table_info.name);
	create_index_info->index_name = index_name;
	D_ASSERT(!create_index_info->index_name.empty());

	// Plan the table scan.
	TableDescription table_description(table_info.catalog, table_info.schema, table_info.name);
	auto table_ref = make_uniq<BaseTableRef>(table_description);
	auto bound_table = Bind(*table_ref);
	if (bound_table->type != TableReferenceType::BASE_TABLE) {
		throw BinderException("can only add an index to a base table");
	}
	auto plan = CreatePlan(*bound_table);
	auto &get = plan->Cast<LogicalGet>();
	get.names = column_list.GetColumnNames();

	auto alter_table_info = unique_ptr_cast<AlterInfo, AlterTableInfo>(std::move(alter_info));
	result.plan = table.catalog.BindAlterAddIndex(*this, table, std::move(plan), std::move(create_index_info),
	                                              std::move(alter_table_info));
	return std::move(result);
}